

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall
HEkk::proofOfPrimalInfeasibility(HEkk *this,HVector *row_ep,HighsInt move_out,HighsInt row_out)

{
  vector<double,_std::allocator<double>_> *result_value;
  vector<int,_std::allocator<int>_> *result_index;
  double *pdVar1;
  bool bVar2;
  uint row;
  pointer piVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  pointer pdVar7;
  HighsOptions *pHVar8;
  ulong uVar9;
  char *pcVar10;
  HighsSparseMatrix *this_00;
  HighsInt iX;
  long lVar11;
  int iVar12;
  HighsInt num_index;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  HighsCDouble HVar19;
  double local_138;
  double local_128;
  double local_118;
  int local_f0;
  int local_ec;
  HighsCDouble local_e8;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double local_c0;
  HighsCDouble local_b8;
  double local_a8;
  _Vector_base<int,_std::allocator<int>_> local_a0;
  _Vector_base<double,_std::allocator<double>_> local_88;
  string local_70;
  string local_50;
  
  bVar2 = this->debug_iteration_report_;
  bVar6 = (this->status_).has_ar_matrix;
  local_a8 = (double)move_out;
  local_b8.hi = 0.0;
  local_b8.lo = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  dVar17 = 0.0;
  local_ec = 0;
  dVar15 = 0.0;
  local_f0 = 0;
  dVar16 = 0.0;
  iVar12 = 0;
  for (lVar11 = 0; lVar11 < row_ep->count; lVar11 = lVar11 + 1) {
    row = (row_ep->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11];
    dVar18 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(int)row];
    dVar4 = getMaxAbsRowValue(this,row);
    if (ABS(dVar4 * dVar18) <= (this->options_->super_HighsOptionsStruct).small_matrix_value) {
      if (((bVar2 != false) && (iVar12 < 0x19)) && (dVar16 < ABS(dVar18))) {
        printf("Zeroed row_ep.array[%6d] = %11.4g due to being small in contribution\n",
               SUB84(dVar18,0),(ulong)row);
        iVar12 = iVar12 + 1;
        dVar16 = ABS(dVar18);
      }
LAB_0033129e:
      (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(int)row] = 0.0;
    }
    else {
      pdVar7 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar4 = pdVar7[(int)row] * local_a8;
      pdVar7[(int)row] = dVar4;
      if (dVar4 <= 0.0) {
        local_d8 = (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[(int)row];
        uStack_d0 = 0;
        bVar5 = highs_isInfinity(local_d8);
        if (bVar5) {
          if (((bVar2 != false) && (local_ec < 0x19)) && (dVar17 < ABS(dVar18))) {
            printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite upper bound\n",(ulong)row);
            local_ec = local_ec + 1;
            dVar17 = ABS(dVar18);
          }
          goto LAB_0033129e;
        }
      }
      else {
        local_d8 = (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[(int)row];
        uStack_d0 = 0;
        bVar5 = highs_isInfinity(-local_d8);
        if (bVar5) {
          if (((bVar2 != false) && (local_f0 < 0x19)) && (dVar15 < ABS(dVar18))) {
            printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite lower bound\n",(ulong)row);
            local_f0 = local_f0 + 1;
            dVar15 = ABS(dVar18);
          }
          goto LAB_0033129e;
        }
      }
      dVar18 = local_d8 *
               (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)row];
      local_b8.hi = local_c8 + dVar18;
      local_c0 = local_c0 +
                 (local_c8 - (local_b8.hi - dVar18)) +
                 (dVar18 - (local_b8.hi - (local_b8.hi - dVar18)));
      local_c8 = local_b8.hi;
      local_b8.lo = local_c0;
    }
  }
  pdVar7 = (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar7;
  }
  result_value = &this->proof_value_;
  result_index = &this->proof_index_;
  piVar3 = (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  this_00 = &(this->lp_).a_matrix_;
  if (bVar6 != false) {
    this_00 = &this->ar_matrix_;
  }
  HighsSparseMatrix::productTransposeQuad(this_00,result_value,result_index,row_ep,-2);
  uVar13 = (ulong)((long)(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  num_index = (HighsInt)uVar13;
  if (bVar2 == false) {
    uVar9 = 0;
    if (0 < num_index) {
      uVar9 = uVar13 & 0xffffffff;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"Row e_p",(allocator *)&local_e8);
    HSimplexNla::reportArray(&this->simplex_nla_,&local_50,(this->lp_).num_col_,row_ep,true);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,"Proof",(allocator *)&local_e8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_88,result_value);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_a0,result_index);
    HSimplexNla::reportVector
              (&this->simplex_nla_,&local_70,num_index,
               (vector<double,_std::allocator<double>_> *)&local_88,
               (vector<int,_std::allocator<int>_> *)&local_a0,true);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
    std::__cxx11::string::~string((string *)&local_70);
    local_138 = 0.0;
    printf("HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = %d; row_ep_scale = %g\n"
           ,(ulong)(uint)row_ep->count,uVar13 & 0xffffffff);
    uVar14 = 0;
    uVar9 = uVar13 & 0xffffffff;
    if (num_index < 1) {
      uVar9 = uVar14;
    }
    iVar12 = 0;
    for (; uVar9 != uVar14; uVar14 = uVar14 + 1) {
      if (((this->basis_).nonbasicFlag_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start
           [(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14]] == '\0') &&
         (dVar15 = ABS((this->proof_value_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar14]),
         iVar12 < 0x19 && local_138 < dVar15)) {
        printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",uVar14 & 0xffffffff);
        iVar12 = iVar12 + 1;
        local_138 = dVar15;
      }
    }
  }
  local_e8.hi = 0.0;
  local_e8.lo = 0.0;
  local_d8 = 0.0;
  local_128 = 0.0;
  local_118 = 0.0;
  dVar15 = 0.0;
  for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    iVar12 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar13];
    dVar17 = (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar13];
    if (dVar17 <= 0.0) {
      bVar6 = highs_isInfinity(-(this->lp_).col_lower_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar12]);
      if (bVar6) {
        dVar16 = local_128 - dVar17;
        dVar17 = (local_128 - (dVar17 + dVar16)) + (-dVar17 - (dVar16 - (dVar17 + dVar16)));
        goto LAB_003315bf;
      }
      pdVar7 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_003315f9:
      dVar17 = dVar17 * pdVar7[iVar12];
      dVar18 = dVar15 + dVar17;
      local_e8.lo = local_d8 +
                    (dVar15 - (dVar18 - dVar17)) + (dVar17 - (dVar18 - (dVar18 - dVar17)));
      local_e8.hi = dVar18;
      local_d8 = local_e8.lo;
    }
    else {
      bVar6 = highs_isInfinity((this->lp_).col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar12]);
      if (!bVar6) {
        pdVar7 = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        goto LAB_003315f9;
      }
      dVar16 = local_128 + dVar17;
      dVar17 = ((dVar16 - dVar17) - dVar16) + dVar17 + (local_128 - (dVar16 - dVar17));
LAB_003315bf:
      local_118 = local_118 + dVar17;
      pHVar8 = this->options_;
      pdVar1 = &(pHVar8->super_HighsOptionsStruct).small_matrix_value;
      dVar18 = dVar15;
      local_128 = dVar16;
      if (*pdVar1 <= dVar16 + local_118 && dVar16 + local_118 != *pdVar1) goto LAB_00331661;
    }
    dVar15 = dVar18;
  }
  pHVar8 = this->options_;
  dVar16 = local_128;
LAB_00331661:
  dVar15 = (pHVar8->super_HighsOptionsStruct).small_matrix_value;
  dVar16 = dVar16 + local_118;
  HVar19 = HighsCDouble::operator-(&local_b8,&local_e8);
  dVar17 = HVar19.lo + HVar19.hi;
  bVar6 = (this->options_->super_HighsOptionsStruct).primal_feasibility_tolerance < dVar17 &&
          dVar16 <= dVar15;
  if (bVar2 != false) {
    pcVar10 = "in";
    if (dVar16 <= dVar15) {
      pcVar10 = "";
    }
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",pcVar10);
    if (dVar16 <= dVar15) {
      local_118._0_4_ = SUB84(dVar17,0);
      printf(" and gap = %g",local_118._0_4_);
    }
    pcVar10 = "false";
    if (bVar6) {
      pcVar10 = "true";
    }
    printf(" so proof is %s\n",pcVar10);
  }
  return bVar6;
}

Assistant:

bool HEkk::proofOfPrimalInfeasibility(HVector& row_ep, const HighsInt move_out,
                                      const HighsInt row_out) {
  // To be called from inside HEkkDual
  HighsLp& lp = this->lp_;

  HighsInt debug_product_report = kDebugReportOff;
  const bool debug_proof_report_on = true;
  bool debug_rows_report = false;
  bool debug_proof_report = false;
  if (debug_iteration_report_) {
    if (debug_proof_report_on)
      debug_product_report = kDebugReportOff;  // kDebugReportAll; //
    debug_rows_report = debug_proof_report_on;
    debug_proof_report = debug_proof_report_on;
  }

  const bool use_row_wise_matrix = status_.has_ar_matrix;
  const bool use_iterative_refinement = false;  // debug_iteration_report_;//
  if (use_iterative_refinement) {
    simplex_nla_.reportArray("Row e_p.0", lp.num_col_, &row_ep, true);
    unitBtranIterativeRefinement(row_out, row_ep);
    simplex_nla_.reportArray("Row e_p.1", lp.num_col_, &row_ep, true);
  }

  // Refine row_ep by removing relatively small values
  double row_ep_scale = 0;
  // if (use_refinement) refineArray(row_ep, row_ep_scale,
  // refinement_tolerance);
  // Determine the maximum absolute value in row_ep
  HighsCDouble proof_lower = 0.0;
  const HighsInt max_num_basic_proof_report = 25;
  const HighsInt max_num_zeroed_report = 25;
  HighsInt num_zeroed_for_small_report = 0;
  double max_zeroed_for_small_value = 0;
  HighsInt num_zeroed_for_lb_report = 0;
  double max_zeroed_for_lb_value = 0;
  HighsInt num_zeroed_for_ub_report = 0;
  double max_zeroed_for_ub_value = 0;
  for (HighsInt iX = 0; iX < row_ep.count; iX++) {
    HighsInt iRow = row_ep.index[iX];
    // Give row_ep the sign of the leaving row - as is done in
    // getDualRayInterface.
    const double row_ep_value = row_ep.array[iRow];
    assert(row_ep_value);
    if (std::abs(row_ep_value * getMaxAbsRowValue(iRow)) <=
        options_->small_matrix_value) {
      if (debug_proof_report) {
        const double abs_row_ep_value = std::abs(row_ep_value);
        if (num_zeroed_for_small_report < max_num_zeroed_report &&
            max_zeroed_for_small_value < abs_row_ep_value) {
          printf(
              "Zeroed row_ep.array[%6d] = %11.4g due to being small in "
              "contribution\n",
              (int)iRow, row_ep_value);
          num_zeroed_for_small_report++;
          max_zeroed_for_small_value = abs_row_ep_value;
        }
      }
      row_ep.array[iRow] = 0.0;
      continue;
    }

    row_ep.array[iRow] *= move_out;

    // make sure infinite sides are not used
    double rowBound;
    if (row_ep.array[iRow] > 0) {
      rowBound = lp.row_lower_[iRow];
      if (highs_isInfinity(-rowBound)) {
        // row lower bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_lb_report < max_num_zeroed_report &&
              max_zeroed_for_lb_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite lower "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_lb_report++;
            max_zeroed_for_lb_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }

    } else {
      rowBound = lp.row_upper_[iRow];
      if (highs_isInfinity(rowBound)) {
        // row upper bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_ub_report < max_num_zeroed_report &&
              max_zeroed_for_ub_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite upper "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_ub_report++;
            max_zeroed_for_ub_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }
    }
    // add up lower bound of proof constraint
    proof_lower += row_ep.array[iRow] * rowBound;
  }
  // Form the proof constraint coefficients
  proof_value_.clear();
  proof_index_.clear();
  vector<double>& proof_value = this->proof_value_;
  vector<HighsInt>& proof_index = this->proof_index_;
  if (use_row_wise_matrix) {
    this->ar_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                          debug_product_report);
  } else {
    lp.a_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                      debug_product_report);
  }

  HighsInt proof_num_nz = proof_index.size();
  if (debug_rows_report) {
    simplex_nla_.reportArray("Row e_p", lp.num_col_, &row_ep, true);
    simplex_nla_.reportVector("Proof", proof_num_nz, proof_value, proof_index,
                              true);
  }
  if (debug_proof_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = "
        "%d; row_ep_scale = %g\n",
        (int)row_ep.count, (int)proof_num_nz, row_ep_scale);
    HighsInt num_basic_proof_report = 0;
    double max_basic_proof_value = 0;
    for (HighsInt i = 0; i < proof_num_nz; ++i) {
      const HighsInt iCol = proof_index[i];
      const double value = proof_value[i];
      const double abs_value = std::abs(value);
      if (!basis_.nonbasicFlag_[iCol] && max_basic_proof_value < abs_value &&
          num_basic_proof_report < max_num_basic_proof_report) {
        printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",
               (int)i, (int)iCol, value);
        max_basic_proof_value = abs_value;
        num_basic_proof_report++;
      }
    }
  }
  HighsCDouble implied_upper = 0.0;
  HighsCDouble sumInf = 0.0;
  for (HighsInt i = 0; i < proof_num_nz; ++i) {
    const HighsInt iCol = proof_index[i];
    const double value = proof_value[i];
    if (value > 0) {
      if (highs_isInfinity(lp.col_upper_[iCol])) {
        sumInf += value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
        // Commented out unreachable code
        //        if (value <= options_->small_matrix_value) continue;
      }
      implied_upper += value * lp.col_upper_[iCol];
    } else {
      if (highs_isInfinity(-lp.col_lower_[iCol])) {
        sumInf += -value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
      }
      implied_upper += value * lp.col_lower_[iCol];
    }
  }
  bool infinite_implied_upper = sumInf > options_->small_matrix_value;
  const double gap = double(proof_lower - implied_upper);
  const bool gap_ok = gap > options_->primal_feasibility_tolerance;
  const bool proof_of_primal_infeasibility = !infinite_implied_upper && gap_ok;

  const double local_report = false;
  if (!proof_of_primal_infeasibility && local_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility: row %6d; gap = %11.4g (%s); "
        "sumInf = %11.4g (%s) so proof is %s\n",
        (int)row_out, gap, highsBoolToString(gap_ok).c_str(), (double)sumInf,
        highsBoolToString(infinite_implied_upper).c_str(),
        highsBoolToString(proof_of_primal_infeasibility).c_str());
  }
  if (debug_proof_report) {
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",
           infinite_implied_upper ? "in" : "");
    if (!infinite_implied_upper) printf(" and gap = %g", gap);
    printf(" so proof is %s\n",
           proof_of_primal_infeasibility ? "true" : "false");
  }
  return proof_of_primal_infeasibility;
}